

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodeinfo.c
# Opt level: O0

bool_t prf_nodeinfo_set(prf_nodeinfo_t *nodeinfo)

{
  prf_nodeinfo_t *ppVar1;
  size_t sVar2;
  char *pcVar3;
  ushort *in_RDI;
  prf_nodeinfo_t *newnodeinfo;
  int i;
  int local_c;
  
  for (local_c = prf_array_count((void *)0x10a335); local_c <= (int)(uint)*in_RDI;
      local_c = local_c + 1) {
    nodetypes = (prf_nodeinfo_t **)prf_array_append_ptr(newnodeinfo,in_RDI);
  }
  if (nodetypes[*in_RDI] != (prf_nodeinfo_t *)0x0) {
    free(nodetypes[*in_RDI]->name);
    free(nodetypes[*in_RDI]);
  }
  ppVar1 = (prf_nodeinfo_t *)malloc(0x48);
  nodetypes[*in_RDI] = ppVar1;
  ppVar1->opcode = *in_RDI;
  ppVar1->flags = in_RDI[1];
  ppVar1->load_f = *(_func_bool_t_prf_node_t_ptr_prf_state_t_ptr_bfile_t_ptr **)(in_RDI + 8);
  ppVar1->save_f = *(_func_bool_t_prf_node_t_ptr_prf_state_t_ptr_bfile_t_ptr **)(in_RDI + 0xc);
  ppVar1->entry_f = *(_func_void_prf_node_t_ptr_prf_state_t_ptr **)(in_RDI + 0x10);
  ppVar1->exit_f = *(_func_void_prf_node_t_ptr_prf_state_t_ptr **)(in_RDI + 0x14);
  ppVar1->traverse_f = *(_func_int_prf_node_t_ptr_prf_state_t_ptr **)(in_RDI + 0x18);
  ppVar1->destroy_f = *(_func_void_prf_node_t_ptr_prf_model_t_ptr **)(in_RDI + 0x1c);
  ppVar1->clone_f =
       *(_func_prf_node_t_ptr_prf_node_t_ptr_prf_model_t_ptr_prf_model_t_ptr **)(in_RDI + 0x20);
  sVar2 = strlen(*(char **)(in_RDI + 4));
  pcVar3 = (char *)malloc(sVar2 + 1);
  ppVar1->name = pcVar3;
  strcpy(ppVar1->name,*(char **)(in_RDI + 4));
  return 1;
}

Assistant:

bool_t
prf_nodeinfo_set(const prf_nodeinfo_t * nodeinfo)
{
    int i;
    prf_nodeinfo_t * newnodeinfo;

    assert(nodeinfo->opcode > 0);

    i = prf_array_count(nodetypes);
    while ( i <= nodeinfo->opcode ) {
        nodetypes = (prf_nodeinfo_t **) prf_array_append_ptr(nodetypes, NULL);
        i++;
    }

    if ( nodetypes[nodeinfo->opcode ] != NULL ) {
        assert(nodetypes[nodeinfo->opcode] != nodeinfo);
        free(nodetypes[nodeinfo->opcode]->name);
        free(nodetypes[nodeinfo->opcode]);
    }

    newnodeinfo = (prf_nodeinfo_t *) malloc(sizeof(struct prf_nodeinfo_s));
    assert(newnodeinfo != NULL);
    nodetypes[ nodeinfo->opcode ] = newnodeinfo;
    newnodeinfo->opcode = nodeinfo->opcode;
    newnodeinfo->flags = nodeinfo->flags;
    newnodeinfo->load_f = nodeinfo->load_f;
    newnodeinfo->save_f = nodeinfo->save_f;
    newnodeinfo->entry_f = nodeinfo->entry_f;
    newnodeinfo->exit_f = nodeinfo->exit_f;
    newnodeinfo->traverse_f = nodeinfo->traverse_f;
    newnodeinfo->destroy_f = nodeinfo->destroy_f;
    newnodeinfo->clone_f = nodeinfo->clone_f;
    newnodeinfo->name = (char *) malloc(strlen(nodeinfo->name) + 1);
    assert(newnodeinfo->name != NULL);
    strcpy(newnodeinfo->name, nodeinfo->name);
    
    return TRUE;
}